

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

int CmpNode(void *p,void *va,void *vb)

{
  int iVar1;
  nodeclass *cb;
  nodeclass *ca;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(*va + 8) + -0x48;
  local_10 = *(long *)(*vb + 8) + -0x48;
  iVar1 = CmpClass(p,&local_8,&local_10);
  return iVar1;
}

Assistant:

static NOINLINE int CmpNode(const void* p, const void* va, const void* vb)
{
    const node* const* a = va;
    const node* const* b = vb;
    const nodeclass* ca = NodeGetClass(*a);
    const nodeclass* cb = NodeGetClass(*b);
    return CmpClass(p,&ca,&cb);
}